

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O0

int mk_sched_check_timeouts(mk_sched_worker *sched,mk_server *server)

{
  mk_list *__mptr;
  mk_list *temp;
  mk_list *head;
  mk_sched_conn *conn;
  int client_timeout;
  mk_server *server_local;
  mk_sched_worker *sched_local;
  
  temp = (sched->timeout_queue).next;
  __mptr = temp->next;
  while (temp != &sched->timeout_queue) {
    if ((((ulong)temp[-0xb].prev & 0x1800000000) == 0) &&
       ((long)((int)temp[-6].next + server->timeout) <= server->clock_context->log_current_utime)) {
      (*(code *)temp[-5].prev[1].prev)((mk_sched_conn *)(temp + -0xb),sched,0xffffffff,server);
      mk_sched_drop_connection((mk_sched_conn *)(temp + -0xb),sched,server);
    }
    temp = __mptr;
    __mptr = __mptr->next;
  }
  return 0;
}

Assistant:

int mk_sched_check_timeouts(struct mk_sched_worker *sched,
                            struct mk_server *server)
{
    int client_timeout;
    struct mk_sched_conn *conn;
    struct mk_list *head;
    struct mk_list *temp;

    /* PENDING CONN TIMEOUT */
    mk_list_foreach_safe(head, temp, &sched->timeout_queue) {
        conn = mk_list_entry(head, struct mk_sched_conn, timeout_head);
        if (conn->event.type & MK_EVENT_IDLE) {
            continue;
        }

        client_timeout = conn->arrive_time + server->timeout;

        /* Check timeout */
        if (client_timeout <= server->clock_context->log_current_utime) {
            MK_TRACE("Scheduler, closing fd %i due TIMEOUT",
                     conn->event.fd);
            MK_LT_SCHED(conn->event.fd, "TIMEOUT_CONN_PENDING");
            conn->protocol->cb_close(conn, sched, MK_SCHED_CONN_TIMEOUT,
                                     server);
            mk_sched_drop_connection(conn, sched, server);
        }
    }

    return 0;
}